

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
Marray<andres::BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Minus<int,int,int>>,int>
          (Marray<int,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int>
          *expression,allocator_type *allocator)

{
  value_type vVar1;
  int *piVar2;
  size_t sVar3;
  size_t *begin;
  size_t *end;
  CoordinateOrder *pCVar4;
  CoordinateOrder *internalCoordinateOrder;
  allocator_type local_61;
  Geometry<std::allocator<unsigned_long>_> local_60;
  
  View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,(allocator_type *)&local_60);
  piVar2 = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)(this + 0x40),*(size_type *)(*(long *)expression + 0x30)
                      ,(void *)0x0);
  *(int **)this = piVar2;
  sVar3 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
          ::dimension((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                       *)expression);
  if (sVar3 == 0) {
    pCVar4 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
             ::coordinateOrder((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                                *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
              (&local_60,0,pCVar4,1,true,&local_61);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_60);
  }
  else {
    begin = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
            ::shapeBegin((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                          *)expression);
    end = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
          ::shapeEnd((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                      *)expression);
    pCVar4 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
             ::coordinateOrder((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                                *)expression);
    internalCoordinateOrder =
         BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
         ::coordinateOrder((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                            *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
              ((Geometry<std::allocator<unsigned_long>> *)&local_60,begin,end,pCVar4,
               internalCoordinateOrder,&local_61);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_60);
  }
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_60);
  sVar3 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
          ::dimension((BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                       *)expression);
  if (sVar3 == 0) {
    marray_detail::Assert<bool>(*(ulong *)(*(long *)expression + 0x30) < 2);
    vVar1 = BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Minus<int,int,int>>
            ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Minus<int,int,int>>
                          *)expression,0);
    **(value_type **)this = vVar1;
  }
  else {
    marray_detail::Assert<bool>(*(ulong *)(*(long *)expression + 0x30) != 0);
    marray_detail::
    operate<andres::marray_detail::Assign<int,int>,int,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Minus<int,int,int>>,int>
              (this,expression);
  }
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const ViewExpression<E, Te>& expression,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(expression.size());
    if(expression.dimension() == 0) {
        this->geometry_ = geometry_type(0, 
            static_cast<const E&>(expression).coordinateOrder(), 
            1, true, dataAllocator_);
    }
    else {
        this->geometry_ = geometry_type(
            static_cast<const E&>(expression).shapeBegin(), 
            static_cast<const E&>(expression).shapeEnd(),
            static_cast<const E&>(expression).coordinateOrder(),
            static_cast<const E&>(expression).coordinateOrder(),
            dataAllocator_);

    }
    const E& e = static_cast<const E&>(expression);
    if(e.dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() < 2);
        this->data_[0] = static_cast<T>(e(0));
    }
    else {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() != 0);
        marray_detail::operate(*this, e, marray_detail::Assign<T, Te>());
    }
    testInvariant();
}